

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subtract.hpp
# Opt level: O2

uhugeint_t
duckdb::SubtractOperatorOverflowCheck::
Operation<duckdb::uhugeint_t,duckdb::uhugeint_t,duckdb::uhugeint_t>
          (uhugeint_t left,uhugeint_t right)

{
  uhugeint_t uVar1;
  bool bVar2;
  OutOfRangeException *this;
  PhysicalType type;
  uhugeint_t rhs;
  allocator local_c1;
  uhugeint_t result;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  rhs.upper = right.upper;
  result.upper = left.upper;
  result.lower = left.lower;
  rhs.lower = rhs.upper;
  bVar2 = Uhugeint::TrySubtractInPlace((Uhugeint *)&result,(uhugeint_t *)right.lower,rhs);
  if (bVar2) {
    uVar1.upper = result.upper;
    uVar1.lower = result.lower;
    return uVar1;
  }
  this = (OutOfRangeException *)__cxa_allocate_exception(0x10);
  ::std::__cxx11::string::string
            ((string *)&local_50,"Overflow in subtraction of %s (%s - %s)!",&local_c1);
  TypeIdToString_abi_cxx11_(&local_70,(duckdb *)0xcb,type);
  NumericHelper::ToString<duckdb::uhugeint_t>(&local_90,left);
  NumericHelper::ToString<duckdb::uhugeint_t>(&local_b0,right);
  OutOfRangeException::
  OutOfRangeException<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>
            (this,&local_50,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_70,
             &local_90,&local_b0);
  __cxa_throw(this,&OutOfRangeException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

static inline TR Operation(TA left, TB right) {
		TR result;
		if (!TrySubtractOperator::Operation(left, right, result)) {
			throw OutOfRangeException("Overflow in subtraction of %s (%s - %s)!", TypeIdToString(GetTypeId<TA>()),
			                          NumericHelper::ToString(left), NumericHelper::ToString(right));
		}
		return result;
	}